

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * mg_set_option(mg_server *server,char *name,char *value)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ns_connection *pnVar4;
  passwd *ppVar5;
  vec vec;
  char buf [100];
  
  uVar1 = get_option_index(name);
  if ((int)uVar1 < 0) {
    return "No such option";
  }
  pcVar3 = server->config_options[uVar1];
  if (value == (char *)0x0 && pcVar3 == (char *)0x0) {
    return (char *)0x0;
  }
  if (pcVar3 == (char *)0x0 || value == (char *)0x0) {
    if (pcVar3 == (char *)0x0) goto LAB_00109579;
  }
  else {
    iVar2 = strcmp(value,pcVar3);
    if (iVar2 == 0) {
      return (char *)0x0;
    }
  }
  free(pcVar3);
  server->config_options[uVar1] = (char *)0x0;
LAB_00109579:
  if ((value != (char *)0x0) && (*value != '\0')) {
    pcVar3 = mg_strdup(value);
    server->config_options[uVar1] = pcVar3;
    if (uVar1 == 0xc) {
      (server->ns_mgr).hexdump_file = pcVar3;
    }
    else {
      if (uVar1 == 0xf) {
        ppVar5 = getpwnam(value);
        if (ppVar5 == (passwd *)0x0) {
          return "Unknown user";
        }
        iVar2 = setgid(ppVar5->pw_gid);
        if (iVar2 == 0) {
          iVar2 = setuid(ppVar5->pw_uid);
          if (iVar2 != 0) {
            return "setuid() failed";
          }
          return (char *)0x0;
        }
        return "setgid() failed";
      }
      if (uVar1 == 0xe) {
        while( true ) {
          value = next_option(value,&vec,(vec *)0x0);
          if (value == (char *)0x0) {
            return (char *)0x0;
          }
          pnVar4 = ns_bind(&server->ns_mgr,vec.ptr,mg_ev_handler,(void *)0x0);
          if (pnVar4 == (ns_connection *)0x0) break;
          ns_sock_to_str(pnVar4->sock,buf,100,2);
          free(server->config_options[uVar1]);
          pcVar3 = mg_strdup(buf);
          server->config_options[uVar1] = pcVar3;
        }
        return "Cannot bind to port";
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *mg_set_option(struct mg_server *server, const char *name,
                          const char *value) {
  int ind = get_option_index(name);
  const char *error_msg = NULL;
  char **v = NULL;

  if (ind < 0) return  "No such option";
  v = &server->config_options[ind];

  // Return success immediately if setting to the same value
  if ((*v == NULL && value == NULL) ||
      (value != NULL && *v != NULL && !strcmp(value, *v))) {
    return NULL;
  }

  if (*v != NULL) {
    free(*v);
    *v = NULL;
  }

  if (value == NULL || value[0] == '\0') return NULL;

  *v = mg_strdup(value);
  DBG(("%s [%s]", name, *v));

  if (ind == LISTENING_PORT) {
    struct vec vec;
    while ((value = next_option(value, &vec, NULL)) != NULL) {
      struct ns_connection *c = ns_bind(&server->ns_mgr, vec.ptr,
                                        mg_ev_handler, NULL);
      if (c== NULL) {
        error_msg = "Cannot bind to port";
        break;
      } else {
        char buf[100];
        ns_sock_to_str(c->sock, buf, sizeof(buf), 2);
        free(*v);
        *v = mg_strdup(buf);
      }
    }
#ifndef MONGOOSE_NO_FILESYSTEM
  } else if (ind == HEXDUMP_FILE) {
    server->ns_mgr.hexdump_file = *v;
#endif
#ifndef _WIN32
  } else if (ind == RUN_AS_USER) {
    struct passwd *pw;
    if ((pw = getpwnam(value)) == NULL) {
      error_msg = "Unknown user";
    } else if (setgid(pw->pw_gid) != 0) {
      error_msg = "setgid() failed";
    } else if (setuid(pw->pw_uid) != 0) {
      error_msg = "setuid() failed";
    }
#endif
  }

  return error_msg;
}